

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Cluster::GetFirst(Cluster *this,BlockEntry **pFirst)

{
  long lVar1;
  long status;
  long len;
  longlong pos;
  BlockEntry **pFirst_local;
  Cluster *this_local;
  
  pos = (longlong)pFirst;
  pFirst_local = (BlockEntry **)this;
  if (this->m_entries_count < 1) {
    lVar1 = Parse(this,&len,&status);
    if (lVar1 < 0) {
      *(undefined8 *)pos = 0;
      return lVar1;
    }
    if (this->m_entries_count < 1) {
      *(undefined8 *)pos = 0;
      return 0;
    }
  }
  if (this->m_entries == (BlockEntry **)0x0) {
    __assert_fail("m_entries",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1cac,"long mkvparser::Cluster::GetFirst(const BlockEntry *&) const");
  }
  *(BlockEntry **)pos = *this->m_entries;
  if (*(long *)pos != 0) {
    return 0;
  }
  __assert_fail("pFirst",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                ,0x1caf,"long mkvparser::Cluster::GetFirst(const BlockEntry *&) const");
}

Assistant:

long Cluster::GetFirst(const BlockEntry*& pFirst) const {
  if (m_entries_count <= 0) {
    long long pos;
    long len;

    const long status = Parse(pos, len);

    if (status < 0) {  // error
      pFirst = NULL;
      return status;
    }

    if (m_entries_count <= 0) {  // empty cluster
      pFirst = NULL;
      return 0;
    }
  }

  assert(m_entries);

  pFirst = m_entries[0];
  assert(pFirst);

  return 0;  // success
}